

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.cpp
# Opt level: O0

void __thiscall MeCab::Writer::~Writer(Writer *this)

{
  whatlog *in_RDI;
  
  *(undefined ***)in_RDI = &PTR__Writer_001c6a50;
  whatlog::~whatlog(in_RDI);
  scoped_string::~scoped_string((scoped_string *)0x145618);
  scoped_string::~scoped_string((scoped_string *)0x145626);
  scoped_string::~scoped_string((scoped_string *)0x145634);
  scoped_string::~scoped_string((scoped_string *)0x145642);
  scoped_string::~scoped_string((scoped_string *)0x145650);
  return;
}

Assistant:

Writer::~Writer() {}